

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_av.c
# Opt level: O0

dtl_error_t dtl_av_sort(dtl_av_t *self,dtl_key_func_t *key,_Bool reverse)

{
  _Bool reverse_local;
  dtl_key_func_t *key_local;
  dtl_av_t *self_local;
  
  if (self == (dtl_av_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else if (key == (dtl_key_func_t *)0x0) {
    self_local._4_4_ = dtl_av_insertion_sort(self,reverse);
  }
  else {
    self_local._4_4_ = 3;
  }
  return self_local._4_4_;
}

Assistant:

dtl_error_t dtl_av_sort(dtl_av_t *self, dtl_key_func_t *key, bool reverse)
{
   if (self != 0)
   {
      if (key != 0)
      {
         return DTL_NOT_IMPLEMENTED_ERROR;
      }
      return dtl_av_insertion_sort(self, reverse);
   }
   return DTL_INVALID_ARGUMENT_ERROR;
}